

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 SyRandomness(SyPRNGCtx *pCtx,void *pBuf,sxu32 nLen)

{
  uchar uVar1;
  undefined8 in_RAX;
  uchar *puVar2;
  byte bVar3;
  uchar *zBuf;
  byte bVar4;
  bool bVar5;
  
  bVar5 = pCtx->nMagic != 0x13c4;
  puVar2 = (uchar *)CONCAT71((int7)((ulong)in_RAX >> 8),bVar5);
  if (nLen != 0 && !bVar5) {
    puVar2 = (uchar *)((ulong)nLen + (long)pBuf);
    do {
      bVar3 = pCtx->i + 1;
      pCtx->i = bVar3;
      uVar1 = pCtx->s[bVar3];
      bVar4 = pCtx->j + uVar1;
      pCtx->j = bVar4;
      pCtx->s[bVar3] = pCtx->s[bVar4];
      pCtx->s[bVar4] = uVar1;
      *(uchar *)pBuf = pCtx->s[(byte)(uVar1 + pCtx->s[bVar3])];
      if (puVar2 <= (uchar *)((long)pBuf + 1)) break;
      bVar3 = pCtx->i + 1;
      pCtx->i = bVar3;
      uVar1 = pCtx->s[bVar3];
      bVar4 = pCtx->j + uVar1;
      pCtx->j = bVar4;
      pCtx->s[bVar3] = pCtx->s[bVar4];
      pCtx->s[bVar4] = uVar1;
      *(uchar *)((long)pBuf + 1) = pCtx->s[(byte)(uVar1 + pCtx->s[bVar3])];
      if (puVar2 <= (uchar *)((long)pBuf + 2)) break;
      bVar3 = pCtx->i + 1;
      pCtx->i = bVar3;
      uVar1 = pCtx->s[bVar3];
      bVar4 = pCtx->j + uVar1;
      pCtx->j = bVar4;
      pCtx->s[bVar3] = pCtx->s[bVar4];
      pCtx->s[bVar4] = uVar1;
      *(uchar *)((long)pBuf + 2) = pCtx->s[(byte)(uVar1 + pCtx->s[bVar3])];
      if (puVar2 <= (uchar *)((long)pBuf + 3)) break;
      bVar3 = pCtx->i + 1;
      pCtx->i = bVar3;
      uVar1 = pCtx->s[bVar3];
      bVar4 = pCtx->j + uVar1;
      pCtx->j = bVar4;
      pCtx->s[bVar3] = pCtx->s[bVar4];
      pCtx->s[bVar4] = uVar1;
      *(uchar *)((long)pBuf + 3) = pCtx->s[(byte)(uVar1 + pCtx->s[bVar3])];
      pBuf = (void *)((long)pBuf + 4);
    } while (pBuf < puVar2);
  }
  return (sxi32)puVar2;
}

Assistant:

JX9_PRIVATE sxi32 SyRandomness(SyPRNGCtx *pCtx, void *pBuf, sxu32 nLen)
{
	unsigned char *zBuf = (unsigned char *)pBuf;
	unsigned char *zEnd = &zBuf[nLen];
#if defined(UNTRUST)
	if( pCtx == 0 || pBuf == 0 || nLen <= 0 ){
		return SXERR_EMPTY;
	}
#endif
	if(pCtx->nMagic != SXPRNG_MAGIC ){
		return SXERR_CORRUPT;
	}
	for(;;){
		if( zBuf >= zEnd ){break;}	zBuf[0] = randomByte(pCtx);	zBuf++;	
		if( zBuf >= zEnd ){break;}	zBuf[0] = randomByte(pCtx);	zBuf++;	
		if( zBuf >= zEnd ){break;}	zBuf[0] = randomByte(pCtx);	zBuf++;	
		if( zBuf >= zEnd ){break;}	zBuf[0] = randomByte(pCtx);	zBuf++;	
	}
	return SXRET_OK;  
}